

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_async_compact_pattern(int n_checkpoints,fdb_config fconfig,bool deletes,bool walflush)

{
  fdb_status fVar1;
  byte in_DL;
  byte in_SIL;
  int in_EDI;
  void *thread_ret;
  pthread_t tid;
  fdb_status status;
  fdb_kvs_handle *snap_db;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  idx_prams_t index_params;
  checkpoint_t verification_checkpoint;
  storage_t *st;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  storage_t *in_stack_000008f0;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  checkpoint_t *v_chk;
  idx_prams_t *in_stack_fffffffffffffae8;
  fdb_kvs_config *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  fdb_config *in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb2f;
  fdb_file_handle *in_stack_fffffffffffffb30;
  storage_t *in_stack_fffffffffffffb50;
  undefined1 local_498 [216];
  fdb_kvs_info *in_stack_fffffffffffffc40;
  fdb_kvs_handle *in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc6f;
  storage_t *in_stack_fffffffffffffc70;
  storage_t *in_stack_fffffffffffffc90;
  fdb_seqnum_t in_stack_fffffffffffffd80;
  fdb_kvs_handle **in_stack_fffffffffffffd88;
  fdb_kvs_handle *in_stack_fffffffffffffd90;
  int local_60;
  int local_5c;
  timeval local_18;
  byte local_6;
  byte local_5;
  int local_4;
  
  v_chk = (checkpoint_t *)&stack0x00000008;
  local_5 = in_SIL & 1;
  local_6 = in_DL & 1;
  local_4 = in_EDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  fdb_get_default_kvs_config();
  memleak_start();
  rm_storage_fs();
  gen_index_params((idx_prams_t *)in_stack_fffffffffffffb30);
  memset(local_498,0,0x430);
  init_storage(in_stack_fffffffffffffb00,
               (fdb_config *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,v_chk,
               (bool)in_stack_fffffffffffffadf);
  pthread_create((pthread_t *)&stack0xfffffffffffffaf0,(pthread_attr_t *)0x0,compact_thread,v_chk);
  local_5c = 0;
  do {
    if (local_4 <= local_5c) {
      pthread_join((pthread_t)in_stack_fffffffffffffaf0,(void **)&stack0xfffffffffffffae8);
      e2e_fdb_shutdown((storage_t *)0x1058c4);
      memleak_end();
      return;
    }
    load_persons(in_stack_000008f0);
    for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
      load_persons(in_stack_000008f0);
      if ((local_5 & 1) != 0) {
        delete_persons(in_stack_fffffffffffffb50);
      }
      e2e_fdb_commit(in_stack_fffffffffffffb30,(bool)in_stack_fffffffffffffb2f);
      fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x254);
        e2e_async_compact_pattern::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x254,"void e2e_async_compact_pattern(int, fdb_config, bool, bool)");
        }
      }
      fVar1 = fdb_snapshot_open(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                in_stack_fffffffffffffd80);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x256);
        e2e_async_compact_pattern::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                        ,0x256,"void e2e_async_compact_pattern(int, fdb_config, bool, bool)");
        }
      }
      update_index(in_stack_fffffffffffffc70,(bool)in_stack_fffffffffffffc6f);
      verify_db(in_stack_fffffffffffffc90);
      fdb_kvs_close((fdb_kvs_handle *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8))
      ;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void e2e_async_compact_pattern(int n_checkpoints, fdb_config fconfig,
                               bool deletes, bool walflush) {
    TEST_INIT();
    int n, i;
    storage_t *st;
    checkpoint_t verification_checkpoint;
    idx_prams_t index_params;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_kvs_info info;
    fdb_kvs_handle *snap_db;
    fdb_status status;
    thread_t tid;
    void *thread_ret;
    n_checkpoints = n_checkpoints * LOAD_FACTOR;

    memleak_start();

    // init
    rm_storage_fs();
    gen_index_params(&index_params);
    memset(&verification_checkpoint, 0, sizeof(checkpoint_t));

    // setup
    st = init_storage(&fconfig, &fconfig, &kvs_config,
            &index_params, &verification_checkpoint, walflush);

    // create compaction thread
    thread_create(&tid, compact_thread, (void*)&fconfig);

    // test
    for ( n = 0; n < n_checkpoints; ++n) {

#ifdef __DEBUG_E2E
        printf("checkpoint: %d\n", n);
#endif
        load_persons(st);
        for (i=0;i<100;++i) {
#ifdef __DEBUG_E2E
            printf("\n\n----%d----\n", i);
#endif
            load_persons(st);
            if (deletes) {
                delete_persons(st);
            }
            e2e_fdb_commit(st->main, walflush);
            status = fdb_get_kvs_info(st->all_docs, &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_snapshot_open(st->all_docs, &snap_db, info.last_seqnum);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            update_index(st, true);
            verify_db(st);
            fdb_kvs_close(snap_db);
        }
    }

    thread_join(tid, &thread_ret);
    // teardown
    e2e_fdb_shutdown(st);

    memleak_end();
}